

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

archive_wstring * archive_wstrncat(archive_wstring *as,wchar_t *p,size_t n)

{
  archive_wstring *paVar1;
  bool bVar2;
  wchar_t *local_30;
  wchar_t *pp;
  size_t s;
  size_t n_local;
  wchar_t *p_local;
  archive_wstring *as_local;
  
  pp = (wchar_t *)0x0;
  local_30 = p;
  while( true ) {
    bVar2 = false;
    if (pp < n) {
      bVar2 = *local_30 != L'\0';
    }
    if (!bVar2) break;
    local_30 = local_30 + 1;
    pp = (wchar_t *)((long)pp + 1);
  }
  paVar1 = archive_wstring_append(as,p,(size_t)pp);
  if (paVar1 == (archive_wstring *)0x0) {
    __archive_errx(1,"Out of memory");
  }
  return paVar1;
}

Assistant:

struct archive_wstring *
archive_wstrncat(struct archive_wstring *as, const wchar_t *p, size_t n)
{
	size_t s;
	const wchar_t *pp;

	/* Like strlen(p), except won't examine positions beyond p[n]. */
	s = 0;
	pp = p;
	while (s < n && *pp) {
		pp++;
		s++;
	}
	if ((as = archive_wstring_append(as, p, s)) == NULL)
		__archive_errx(1, "Out of memory");
	return (as);
}